

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

ssize_t sf_parse_item(nghttp2_sf_value *dest,uint8_t *begin,uint8_t *end)

{
  ssize_t sVar1;
  ssize_t sVar2;
  uint8_t *puVar3;
  
  sVar1 = sf_parse_bare_item(dest,begin,end);
  puVar3 = (uint8_t *)0xffffffffffffffff;
  if (-1 < sVar1) {
    sVar2 = sf_parse_params(begin + sVar1,end);
    if (-1 < sVar2) {
      puVar3 = begin + sVar1 + (sVar2 - (long)begin);
    }
  }
  return (ssize_t)puVar3;
}

Assistant:

static ssize_t sf_parse_item(nghttp2_sf_value *dest, const uint8_t *begin,
                             const uint8_t *end) {
  const uint8_t *p = begin;
  ssize_t slen;

  slen = sf_parse_bare_item(dest, p, end);
  if (slen < 0) {
    return -1;
  }

  p += slen;

  slen = sf_parse_params(p, end);
  if (slen < 0) {
    return -1;
  }

  p += slen;

  return p - begin;
}